

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_util.cpp
# Opt level: O3

void __thiscall
duckdb::HTTPUtil::ParseHTTPProxyHost
          (HTTPUtil *this,string *proxy_value,string *hostname_out,idx_t *port_out,
          idx_t default_port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  reference pvVar6;
  InvalidInputException *pIVar7;
  pointer __src;
  undefined1 strict;
  string_t input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  proxy_split;
  idx_t port;
  string sanitized_proxy_value;
  string local_130;
  string *local_110;
  string *local_108;
  uint local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 local_f4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  _Alloc_hider local_d8;
  string local_d0;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  strict = (undefined1)default_port;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_110 = hostname_out;
  local_108 = proxy_value;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"http://","");
  puVar2 = local_90;
  if (local_a8 < local_88) {
    bVar3 = false;
  }
  else if (local_88 == 0) {
    bVar3 = true;
  }
  else {
    iVar4 = bcmp(local_90,local_b0,local_88);
    bVar3 = iVar4 == 0;
  }
  if (puVar2 != local_80) {
    operator_delete(puVar2);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (bVar3) {
    ::std::__cxx11::string::substr((ulong)&local_130,(ulong)this);
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  paVar1 = &local_130.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,":","");
  StringUtil::Split(&local_f0,&local_d0,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  lVar5 = (long)local_f0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar5 == 2) {
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_f0,1);
    __src = (pvVar6->_M_dataplus)._M_p;
    local_100 = (uint)pvVar6->_M_string_length;
    if (local_100 < 0xd) {
      local_f4 = 0;
      uStack_fc = 0;
      uStack_f8 = 0;
      if (local_100 == 0) {
        __src = (pointer)0x0;
      }
      else {
        switchD_015df945::default(&uStack_fc,__src,(ulong)(local_100 & 0xf));
        __src = (pointer)CONCAT44(local_f4,uStack_f8);
      }
    }
    else {
      uStack_fc = *(undefined4 *)__src;
    }
    input.value.pointer.ptr = (char *)&local_d8;
    input.value._0_8_ = __src;
    bVar3 = TryCast::Operation<duckdb::string_t,unsigned_long>
                      ((TryCast *)CONCAT44(uStack_fc,local_100),input,(uint64_t *)0x0,(bool)strict);
    if (!bVar3) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_130._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"Failed to parse port from http_proxy \'%s\'","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)this,*(long *)(this + 8) + *(long *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar7,&local_130,&local_50);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](&local_f0,0);
    ::std::__cxx11::string::_M_assign((string *)local_108);
    (local_110->_M_dataplus)._M_p = local_d8._M_p;
  }
  else {
    if (lVar5 != 1) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_130._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"Failed to parse http_proxy \'%s\' into a host and port","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)this,*(long *)(this + 8) + *(long *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar7,&local_130,&local_70);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](&local_f0,0);
    ::std::__cxx11::string::_M_assign((string *)local_108);
    (local_110->_M_dataplus)._M_p = (pointer)port_out;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HTTPUtil::ParseHTTPProxyHost(string &proxy_value, string &hostname_out, idx_t &port_out, idx_t default_port) {
	auto sanitized_proxy_value = proxy_value;
	if (StringUtil::StartsWith(proxy_value, "http://")) {
		sanitized_proxy_value = proxy_value.substr(7);
	}
	auto proxy_split = StringUtil::Split(sanitized_proxy_value, ":");
	if (proxy_split.size() == 1) {
		hostname_out = proxy_split[0];
		port_out = default_port;
	} else if (proxy_split.size() == 2) {
		idx_t port;
		if (!TryCast::Operation<string_t, idx_t>(proxy_split[1], port, false)) {
			throw InvalidInputException("Failed to parse port from http_proxy '%s'", proxy_value);
		}
		hostname_out = proxy_split[0];
		port_out = port;
	} else {
		throw InvalidInputException("Failed to parse http_proxy '%s' into a host and port", proxy_value);
	}
}